

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pattern_formatter-inl.h
# Opt level: O2

void __thiscall
spdlog::details::source_location_formatter<spdlog::details::scoped_padder>::format
          (source_location_formatter<spdlog::details::scoped_padder> *this,log_msg *msg,tm *param_2,
          memory_buf_t *dest)

{
  uint32_t n;
  fmt_helper *this_00;
  uint uVar1;
  size_t sVar2;
  char *pcVar3;
  memory_buf_t *dest_00;
  size_t wrapped_size;
  string_view_t view;
  scoped_padder p;
  char local_51;
  scoped_padder local_50;
  
  n = (msg->source).line;
  if (n != 0) {
    if ((this->super_flag_formatter).padinfo_.enabled_ == true) {
      sVar2 = strlen((msg->source).filename);
      uVar1 = fmt::v6::internal::count_digits(n);
      wrapped_size = sVar2 + uVar1 + 1;
    }
    else {
      wrapped_size = 0;
    }
    dest_00 = dest;
    scoped_padder::scoped_padder(&local_50,wrapped_size,&(this->super_flag_formatter).padinfo_,dest)
    ;
    this_00 = (fmt_helper *)(msg->source).filename;
    pcVar3 = (char *)strlen((char *)this_00);
    view.size_ = (size_t)dest;
    view.data_ = pcVar3;
    fmt_helper::append_string_view(this_00,view,dest_00);
    local_51 = ':';
    fmt::v6::internal::buffer<char>::push_back(&dest->super_buffer<char>,&local_51);
    fmt_helper::append_int<int>((msg->source).line,dest);
    scoped_padder::~scoped_padder(&local_50);
  }
  return;
}

Assistant:

explicit B_formatter(padding_info padinfo)
        : flag_formatter(padinfo)
    {}